

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void QHashPrivate::MultiNode<QByteArray,QByteArray>::createInPlace<QByteArray_const&>
               (MultiNode<QByteArray,_QByteArray> *n,QByteArray *k,QByteArray *args)

{
  Data *pDVar1;
  char *pcVar2;
  qsizetype qVar3;
  Chain *pCVar4;
  
  pCVar4 = (Chain *)operator_new(0x20);
  pDVar1 = (args->d).d;
  (pCVar4->value).d.d = pDVar1;
  (pCVar4->value).d.ptr = (args->d).ptr;
  (pCVar4->value).d.size = (args->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pCVar4->next = (MultiNodeChain<QByteArray> *)0x0;
  pDVar1 = (k->d).d;
  (k->d).d = (Data *)0x0;
  (n->key).d.d = pDVar1;
  pcVar2 = (k->d).ptr;
  (k->d).ptr = (char *)0x0;
  (n->key).d.ptr = pcVar2;
  qVar3 = (k->d).size;
  (k->d).size = 0;
  (n->key).d.size = qVar3;
  n->value = pCVar4;
  return;
}

Assistant:

static void createInPlace(MultiNode *n, Key &&k, Args &&... args)
    { new (n) MultiNode(std::move(k), new Chain{ T(std::forward<Args>(args)...), nullptr }); }